

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall CLI::App::check_name(App *this,string *name_to_check)

{
  pointer pcVar1;
  pointer pbVar2;
  int iVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  pointer pbVar5;
  bool bVar6;
  bool bVar7;
  string les;
  string local_name;
  undefined1 local_159;
  string *local_158;
  char *local_150;
  size_t local_148;
  char local_140 [8];
  undefined8 uStack_138;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  long local_128;
  char local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  char *local_110;
  long local_108;
  char local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  long local_e8;
  char local_e0 [8];
  undefined8 uStack_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  long local_c8;
  char local_c0 [8];
  undefined8 uStack_b8;
  char *local_b0;
  long local_a8;
  char local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  char *local_90;
  size_t local_88;
  char local_80 [8];
  undefined8 uStack_78;
  char *local_70;
  long local_68;
  char local_60 [8];
  undefined8 uStack_58;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  pcVar1 = (this->name_)._M_dataplus._M_p;
  local_158 = name_to_check;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->name_)._M_string_length);
  if (this->ignore_underscore_ == true) {
    pcVar1 = (this->name_)._M_dataplus._M_p;
    local_d0._M_current = local_c0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + (this->name_)._M_string_length);
    local_110 = (char *)CONCAT71(local_110._1_7_,0x5f);
    _Var4 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_d0,local_d0._M_current + local_c8,
                       (_Iter_equals_val<const_char>)&local_110);
    local_148 = (long)_Var4._M_current - (long)local_d0._M_current;
    *_Var4._M_current = '\0';
    if (local_d0._M_current == local_c0) {
      uStack_138 = uStack_b8;
      local_150 = local_140;
    }
    else {
      local_150 = local_d0._M_current;
    }
    local_c8 = 0;
    local_c0[0] = '\0';
    local_d0._M_current = local_c0;
    ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_150);
    if (local_150 != local_140) {
      operator_delete(local_150);
    }
    if (local_d0._M_current != local_c0) {
      operator_delete(local_d0._M_current);
    }
    pcVar1 = (local_158->_M_dataplus)._M_p;
    local_f0._M_current = local_e0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar1,pcVar1 + local_158->_M_string_length);
    local_110 = (char *)CONCAT71(local_110._1_7_,0x5f);
    _Var4 = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_f0,local_f0._M_current + local_e8,
                       (_Iter_equals_val<const_char>)&local_110);
    local_148 = (long)_Var4._M_current - (long)local_f0._M_current;
    *_Var4._M_current = '\0';
    if (local_f0._M_current == local_e0) {
      uStack_138 = uStack_d8;
      local_150 = local_140;
    }
    else {
      local_150 = local_f0._M_current;
    }
    local_e8 = 0;
    local_e0[0] = '\0';
    local_f0._M_current = local_e0;
    ::std::__cxx11::string::operator=((string *)local_158,(string *)&local_150);
    if (local_150 != local_140) {
      operator_delete(local_150);
    }
    if (local_f0._M_current != local_e0) {
      operator_delete(local_f0._M_current);
    }
  }
  if (this->ignore_case_ == true) {
    pcVar1 = (this->name_)._M_dataplus._M_p;
    local_70 = local_60;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (this->name_)._M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_70,local_70 + local_68,local_70);
    if (local_70 == local_60) {
      uStack_138 = uStack_58;
      local_150 = local_140;
    }
    else {
      local_150 = local_70;
    }
    local_148 = local_68;
    local_68 = 0;
    local_60[0] = '\0';
    local_70 = local_60;
    ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_150);
    if (local_150 != local_140) {
      operator_delete(local_150);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    pcVar1 = (local_158->_M_dataplus)._M_p;
    local_90 = local_80;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + local_158->_M_string_length);
    ::std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
              (local_90,local_90 + local_88,local_90);
    if (local_90 == local_80) {
      uStack_138 = uStack_78;
      local_150 = local_140;
    }
    else {
      local_150 = local_90;
    }
    local_148 = local_88;
    local_88 = 0;
    local_80[0] = '\0';
    local_90 = local_80;
    ::std::__cxx11::string::operator=((string *)local_158,(string *)&local_150);
    if (local_150 != local_140) {
      operator_delete(local_150);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
  }
  if (local_48 == local_158->_M_string_length) {
    bVar6 = true;
    if (local_48 == 0) goto LAB_00135842;
    iVar3 = bcmp(local_50,(local_158->_M_dataplus)._M_p,local_48);
    if (iVar3 == 0) goto LAB_00135842;
  }
  pbVar5 = (this->aliases_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->aliases_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pbVar5 != pbVar2;
  if (bVar6) {
    do {
      local_150 = local_140;
      pcVar1 = (pbVar5->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,pcVar1,pcVar1 + pbVar5->_M_string_length);
      if (this->ignore_underscore_ == true) {
        local_130._M_current = &local_120;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_150,local_150 + local_148);
        local_159 = 0x5f;
        _Var4 = ::std::
                __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (local_130,local_130._M_current + local_128,
                           (_Iter_equals_val<const_char>)&local_159);
        local_108 = (long)_Var4._M_current - (long)local_130._M_current;
        *_Var4._M_current = '\0';
        if (local_130._M_current == &local_120) {
          uStack_f8 = uStack_118;
          local_110 = &local_100;
        }
        else {
          local_110 = local_130._M_current;
        }
        _local_100 = CONCAT71(uStack_11f,local_120);
        local_128 = 0;
        local_120 = '\0';
        local_130._M_current = &local_120;
        ::std::__cxx11::string::operator=((string *)&local_150,(string *)&local_110);
        if (local_110 != &local_100) {
          operator_delete(local_110);
        }
        if (local_130._M_current != &local_120) {
          operator_delete(local_130._M_current);
        }
      }
      if (this->ignore_case_ == true) {
        local_b0 = &local_a0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_150,local_150 + local_148);
        ::std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                  (local_b0,local_b0 + local_a8,local_b0);
        if (local_b0 == &local_a0) {
          uStack_f8 = uStack_98;
          local_110 = &local_100;
        }
        else {
          local_110 = local_b0;
        }
        _local_100 = CONCAT71(uStack_9f,local_a0);
        local_108 = local_a8;
        local_a8 = 0;
        local_a0 = '\0';
        local_b0 = &local_a0;
        ::std::__cxx11::string::operator=((string *)&local_150,(string *)&local_110);
        if (local_110 != &local_100) {
          operator_delete(local_110);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
      }
      if (local_148 == local_158->_M_string_length) {
        if (local_148 == 0) {
          bVar7 = true;
        }
        else {
          iVar3 = bcmp(local_150,(local_158->_M_dataplus)._M_p,local_148);
          bVar7 = iVar3 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if (local_150 != local_140) {
        operator_delete(local_150);
      }
      if (bVar7) break;
      pbVar5 = pbVar5 + 1;
      bVar6 = pbVar5 != pbVar2;
    } while (bVar6);
  }
LAB_00135842:
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return bVar6;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool App::check_name(std::string name_to_check) const {
    std::string local_name = name_;
    if(ignore_underscore_) {
        local_name = detail::remove_underscore(name_);
        name_to_check = detail::remove_underscore(name_to_check);
    }
    if(ignore_case_) {
        local_name = detail::to_lower(name_);
        name_to_check = detail::to_lower(name_to_check);
    }

    if(local_name == name_to_check) {
        return true;
    }
    for(std::string les : aliases_) {  // NOLINT(performance-for-range-copy)
        if(ignore_underscore_) {
            les = detail::remove_underscore(les);
        }
        if(ignore_case_) {
            les = detail::to_lower(les);
        }
        if(les == name_to_check) {
            return true;
        }
    }
    return false;
}